

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int expect(int id)

{
  int iVar1;
  char *pcVar2;
  char buf [16];
  char acStack_28 [24];
  
  iVar1 = t->id;
  if (iVar1 != id) {
    pcVar2 = token_name(id);
    strcpy(acStack_28,pcVar2);
    pcVar2 = token_name(last_id);
    err(E,"expected %s after %s",acStack_28,pcVar2);
  }
  else {
    last_id = iVar1;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
  }
  return (uint)(iVar1 == id);
}

Assistant:

int expect(int id)
{
    char buf[16];
    if (accept(id))
        return 1;
    strcpy(buf, token_name(id));
    err(E, "expected %s after %s", buf, token_name(last_id));
    return 0;
}